

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O2

S2Point * S2::GetVNorm(S2Point *__return_storage_ptr__,int face,double v)

{
  VType VVar1;
  VType VVar2;
  VType VVar3;
  
  VVar2 = 0.0;
  VVar1 = -1.0;
  VVar3 = v;
  switch(face) {
  case 0:
    VVar3 = -v;
    VVar2 = 1.0;
    VVar1 = 0.0;
  case 3:
    break;
  case 1:
    VVar1 = -v;
    VVar2 = 1.0;
    VVar3 = 0.0;
    break;
  case 2:
    VVar2 = -v;
    VVar3 = 0.0;
    break;
  case 4:
    VVar3 = 1.0;
    VVar1 = v;
    break;
  default:
    VVar3 = 1.0;
    VVar1 = 0.0;
    VVar2 = v;
  }
  __return_storage_ptr__->c_[0] = VVar3;
  __return_storage_ptr__->c_[1] = VVar1;
  __return_storage_ptr__->c_[2] = VVar2;
  return __return_storage_ptr__;
}

Assistant:

inline S2Point GetVNorm(int face, double v) {
  switch (face) {
    case 0:  return S2Point(-v,  0,  1);
    case 1:  return S2Point( 0, -v,  1);
    case 2:  return S2Point( 0, -1, -v);
    case 3:  return S2Point( v, -1,  0);
    case 4:  return S2Point( 1,  v,  0);
    default: return S2Point( 1,  0,  v);
  }
}